

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_visit.c
# Opt level: O2

int pop_and_stop(json_object *jso,int flags,json_object *parent_jso,char *jso_key,size_t *jso_index,
                void *userarg)

{
  int iVar1;
  char *__s;
  
  emit_object(jso,flags,parent_jso,jso_key,jso_index,userarg);
  iVar1 = 0;
  if (jso_key != (char *)0x0) {
    iVar1 = strcmp(jso_key,"subobj1");
    if (iVar1 == 0) {
      iVar1 = 0x2ff;
      __s = "POP after handling subobj1";
    }
    else {
      iVar1 = strcmp(jso_key,"obj3");
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = 0x1ebb;
      __s = "STOP after handling obj3";
    }
    puts(__s);
  }
  return iVar1;
}

Assistant:

static int pop_and_stop(json_object *jso, int flags, json_object *parent_jso, const char *jso_key,
                        size_t *jso_index, void *userarg)
{
	(void)emit_object(jso, flags, parent_jso, jso_key, jso_index, userarg);
	if (jso_key != NULL && strcmp(jso_key, "subobj1") == 0)
	{
		printf("POP after handling subobj1\n");
		return JSON_C_VISIT_RETURN_POP;
	}
	if (jso_key != NULL && strcmp(jso_key, "obj3") == 0)
	{
		printf("STOP after handling obj3\n");
		return JSON_C_VISIT_RETURN_STOP;
	}
	return JSON_C_VISIT_RETURN_CONTINUE;
}